

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void av1_set_frame_size(AV1_COMP *cpi,int width,int height)

{
  _Bool resize;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  AV1_COMMON *cm_00;
  RefCntBuffer *pRVar7;
  scale_factors *sf_00;
  int in_EDX;
  int in_ESI;
  AV1_COMP *in_RDI;
  bool bVar8;
  _Bool in_stack_00000033;
  int in_stack_00000034;
  int in_stack_00000038;
  int in_stack_0000003c;
  int in_stack_00000040;
  int in_stack_00000044;
  YV12_BUFFER_CONFIG *in_stack_00000048;
  _Bool dropped_frame;
  scale_factors *sf;
  RefCntBuffer *buf;
  int has_valid_ref_frame;
  _Bool is_sgr_enabled;
  int i;
  AV1EncoderConfig *oxcf;
  CommonContexts *above_contexts;
  int ref_frame;
  MACROBLOCKD *xd;
  int in_stack_00000098;
  int num_planes;
  SequenceHeader *seq_params;
  AV1_COMMON *cm;
  int in_stack_000000c0;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined8 in_stack_ffffffffffffff48;
  AV1_COMP *in_stack_ffffffffffffff50;
  AV1_COMP *cpi_00;
  undefined2 uVar9;
  AV1_COMP *in_stack_ffffffffffffff58;
  MACROBLOCKD *xd_00;
  undefined4 in_stack_ffffffffffffff64;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 is_sgr_enabled_00;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  byte local_72;
  uint local_5c;
  int local_54;
  int local_3c;
  
  is_sgr_enabled_00 = (undefined1)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  cm_00 = &in_RDI->common;
  iVar1 = av1_num_planes(cm_00);
  if ((in_ESI != (in_RDI->common).width) || (in_EDX != (in_RDI->common).height)) {
    set_size_literal(in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                     (int)in_stack_ffffffffffffff50);
    local_72 = 0;
    if (((in_RDI->common).features.coded_lossless & 1U) != 0) {
      iVar2 = av1_superres_scaled(cm_00);
      local_72 = iVar2 != 0 ^ 0xff;
    }
    (in_RDI->common).features.all_lossless = (_Bool)(local_72 & 1);
    av1_noise_estimate_init(&in_RDI->noise_estimate,(in_RDI->common).width,(in_RDI->common).height);
  }
  iVar2 = is_stat_consumption_stage
                    ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if (iVar2 != 0) {
    av1_set_target_rate(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                        (int)in_stack_ffffffffffffff48);
  }
  iVar5 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  alloc_frame_mvs((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  (RefCntBuffer *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  iVar2 = (in_RDI->common).above_contexts.num_planes;
  iVar3 = av1_num_planes(cm_00);
  if (((iVar2 < iVar3) ||
      ((in_RDI->common).above_contexts.num_mi_cols < (in_RDI->common).mi_params.mi_cols)) ||
     ((in_RDI->common).above_contexts.num_tile_rows < (in_RDI->common).tiles.rows)) {
    av1_free_above_context_buffers
              ((CommonContexts *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    in_stack_ffffffffffffff80 = (in_RDI->common).tiles.rows;
    in_stack_ffffffffffffff84 = (in_RDI->common).mi_params.mi_cols;
    is_sgr_enabled_00 = (char)((ulong)&(in_RDI->common).above_contexts >> 0x38);
    av1_num_planes(cm_00);
    iVar2 = av1_alloc_above_context_buffers
                      ((CommonContexts *)in_stack_ffffffffffffff58,
                       (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                       (int)in_stack_ffffffffffffff50,iVar5);
    if (iVar2 != 0) {
      aom_internal_error((in_RDI->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate context buffers");
    }
  }
  resize = av1_is_resize_needed(&in_RDI->oxcf);
  iVar2 = av1_get_enc_border_size
                    (resize,(in_RDI->oxcf).kf_cfg.key_freq_max == 0,
                     ((in_RDI->common).seq_params)->sb_size);
  (in_RDI->oxcf).border_in_pixels = iVar2;
  iVar2 = (in_RDI->oxcf).border_in_pixels;
  iVar3 = (in_RDI->common).features.byte_alignment;
  cpi_00 = (AV1_COMP *)0x0;
  xd_00 = (MACROBLOCKD *)0x0;
  uVar4 = (uint)(in_RDI->alloc_pyramid & 1);
  iVar5 = aom_realloc_frame_buffer
                    (in_stack_00000048,in_stack_00000044,in_stack_00000040,in_stack_0000003c,
                     in_stack_00000038,in_stack_00000034,(int)xd,in_stack_00000098,
                     (aom_codec_frame_buffer_t *)seq_params,(aom_get_frame_buffer_cb_fn_t)cm,
                     (void *)CONCAT44(width,height),in_stack_00000033,in_stack_000000c0);
  if (iVar5 != 0) {
    aom_internal_error((in_RDI->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate frame buffer")
    ;
  }
  iVar5 = is_stat_generation_stage(in_RDI);
  if (iVar5 == 0) {
    av1_init_cdef_worker((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff44,iVar3));
  }
  iVar5 = is_restoration_used(cm_00);
  if (iVar5 != 0) {
    for (local_54 = 0; local_54 < iVar1; local_54 = local_54 + 1) {
      (in_RDI->common).rst_info[local_54].frame_restoration_type = RESTORE_NONE;
    }
    av1_alloc_restoration_buffers
              ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (_Bool)is_sgr_enabled_00);
    if (1 < (in_RDI->ppi->p_mt_info).num_workers) {
      av1_init_lr_mt_buffers(cpi_00);
    }
  }
  init_motion_estimation((AV1_COMP *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  local_5c = 0;
  for (local_3c = 1; uVar9 = (undefined2)((ulong)cpi_00 >> 0x30), local_3c < 8;
      local_3c = local_3c + 1) {
    pRVar7 = get_ref_frame_buf((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff44,iVar3),
                               (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffff3c >> 0x18));
    if (pRVar7 != (RefCntBuffer *)0x0) {
      sf_00 = get_ref_scale_factors
                        ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff44,iVar3),
                         (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffff3c >> 0x18));
      av1_setup_scale_factors_for_frame
                ((scale_factors *)CONCAT44(in_stack_ffffffffffffff44,iVar3),
                 in_stack_ffffffffffffff3c,iVar2,0,0x21bc08);
      uVar6 = av1_is_valid_scale(sf_00);
      local_5c = uVar6 | local_5c;
      iVar1 = av1_is_scaled((scale_factors *)CONCAT44(in_stack_ffffffffffffff44,iVar3));
      if (iVar1 != 0) {
        aom_extend_frame_borders_c
                  ((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffff44,iVar3),
                   in_stack_ffffffffffffff3c);
      }
    }
  }
  iVar1 = has_no_stats_stage(in_RDI);
  bVar8 = false;
  if (((iVar1 != 0) && (bVar8 = false, (in_RDI->oxcf).rc_cfg.mode == AOM_CBR)) &&
     (bVar8 = false, 0 < (in_RDI->svc).spatial_layer_id)) {
    bVar8 = (in_RDI->oxcf).rc_cfg.target_bandwidth == 0;
  }
  iVar1 = frame_is_intra_only(cm_00);
  if (((iVar1 == 0) && (local_5c == 0)) && (!bVar8)) {
    aom_internal_error((in_RDI->common).error,AOM_CODEC_CORRUPT_FRAME,
                       "Can\'t find at least one reference frame with valid size");
  }
  av1_setup_scale_factors_for_frame
            ((scale_factors *)CONCAT44(in_stack_ffffffffffffff44,iVar3),in_stack_ffffffffffffff3c,
             iVar2,0,0x21bd44);
  set_ref_ptrs((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff64,uVar4),xd_00,
               (MV_REFERENCE_FRAME)((ushort)uVar9 >> 8),(MV_REFERENCE_FRAME)uVar9);
  return;
}

Assistant:

void av1_set_frame_size(AV1_COMP *cpi, int width, int height) {
  AV1_COMMON *const cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;
  int ref_frame;

  if (width != cm->width || height != cm->height) {
    // There has been a change in the encoded frame size
    set_size_literal(cpi, width, height);
    // Recalculate 'all_lossless' in case super-resolution was (un)selected.
    cm->features.all_lossless =
        cm->features.coded_lossless && !av1_superres_scaled(cm);

    av1_noise_estimate_init(&cpi->noise_estimate, cm->width, cm->height);
#if CONFIG_AV1_TEMPORAL_DENOISING
    // Reset the denoiser on the resized frame.
    if (cpi->oxcf.noise_sensitivity > 0) {
      av1_denoiser_free(&(cpi->denoiser));
      setup_denoiser_buffer(cpi);
    }
#endif
  }
  if (is_stat_consumption_stage(cpi)) {
    av1_set_target_rate(cpi, cm->width, cm->height);
  }

  alloc_frame_mvs(cm, cm->cur_frame);

  // Allocate above context buffers
  CommonContexts *const above_contexts = &cm->above_contexts;
  if (above_contexts->num_planes < av1_num_planes(cm) ||
      above_contexts->num_mi_cols < cm->mi_params.mi_cols ||
      above_contexts->num_tile_rows < cm->tiles.rows) {
    av1_free_above_context_buffers(above_contexts);
    if (av1_alloc_above_context_buffers(above_contexts, cm->tiles.rows,
                                        cm->mi_params.mi_cols,
                                        av1_num_planes(cm)))
      aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate context buffers");
  }

  AV1EncoderConfig *oxcf = &cpi->oxcf;
  oxcf->border_in_pixels = av1_get_enc_border_size(
      av1_is_resize_needed(oxcf), oxcf->kf_cfg.key_freq_max == 0,
      cm->seq_params->sb_size);

  // Reset the frame pointers to the current frame size.
  if (aom_realloc_frame_buffer(
          &cm->cur_frame->buf, cm->width, cm->height, seq_params->subsampling_x,
          seq_params->subsampling_y, seq_params->use_highbitdepth,
          cpi->oxcf.border_in_pixels, cm->features.byte_alignment, NULL, NULL,
          NULL, cpi->alloc_pyramid, 0))
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate frame buffer");

  if (!is_stat_generation_stage(cpi)) av1_init_cdef_worker(cpi);

#if !CONFIG_REALTIME_ONLY
  if (is_restoration_used(cm)) {
    for (int i = 0; i < num_planes; ++i)
      cm->rst_info[i].frame_restoration_type = RESTORE_NONE;

    const bool is_sgr_enabled = !cpi->sf.lpf_sf.disable_sgr_filter;
    av1_alloc_restoration_buffers(cm, is_sgr_enabled);
    // Store the allocated restoration buffers in MT object.
    if (cpi->ppi->p_mt_info.num_workers > 1) {
      av1_init_lr_mt_buffers(cpi);
    }
  }
#endif

  init_motion_estimation(cpi);

  int has_valid_ref_frame = 0;
  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    if (buf != NULL) {
      struct scale_factors *sf = get_ref_scale_factors(cm, ref_frame);
      av1_setup_scale_factors_for_frame(sf, buf->buf.y_crop_width,
                                        buf->buf.y_crop_height, cm->width,
                                        cm->height);
      has_valid_ref_frame |= av1_is_valid_scale(sf);
      if (av1_is_scaled(sf)) aom_extend_frame_borders(&buf->buf, num_planes);
    }
  }
  // For 1 pass CBR mode: we can skip this check for spatial enhancement
  // layer if the target_bandwidth is zero, since it will be dropped.
  const bool dropped_frame =
      has_no_stats_stage(cpi) && cpi->oxcf.rc_cfg.mode == AOM_CBR &&
      cpi->svc.spatial_layer_id > 0 && cpi->oxcf.rc_cfg.target_bandwidth == 0;
  if (!frame_is_intra_only(cm) && !has_valid_ref_frame && !dropped_frame) {
    aom_internal_error(
        cm->error, AOM_CODEC_CORRUPT_FRAME,
        "Can't find at least one reference frame with valid size");
  }

  av1_setup_scale_factors_for_frame(&cm->sf_identity, cm->width, cm->height,
                                    cm->width, cm->height);

  set_ref_ptrs(cm, xd, LAST_FRAME, LAST_FRAME);
}